

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseExternalSubset(xmlParserCtxtPtr ctxt,xmlChar *ExternalID,xmlChar *SystemID)

{
  int iVar1;
  unsigned_long uVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  xmlCharEncoding enc_00;
  xmlDocPtr pxVar5;
  bool bVar6;
  unsigned_long cons;
  int id;
  xmlCharEncoding enc;
  xmlChar start [4];
  xmlChar *SystemID_local;
  xmlChar *ExternalID_local;
  xmlParserCtxtPtr ctxt_local;
  
  _enc = SystemID;
  xmlDetectSAX2(ctxt);
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  if ((ctxt->encoding == (xmlChar *)0x0) && (3 < (long)ctxt->input->end - (long)ctxt->input->cur)) {
    id._0_1_ = *ctxt->input->cur;
    id._1_1_ = ctxt->input->cur[1];
    id._2_1_ = ctxt->input->cur[2];
    id._3_1_ = ctxt->input->cur[3];
    enc_00 = xmlDetectCharEncoding((uchar *)&id,4);
    if (enc_00 != XML_CHAR_ENCODING_NONE) {
      xmlSwitchEncoding(ctxt,enc_00);
    }
  }
  if ((((*ctxt->input->cur == '<') && (ctxt->input->cur[1] == '?')) && (ctxt->input->cur[2] == 'x'))
     && (((ctxt->input->cur[3] == 'm' && (ctxt->input->cur[4] == 'l')) &&
         (xmlParseTextDecl(ctxt), ctxt->errNo == 0x20)))) {
    xmlHaltParser(ctxt);
  }
  else {
    if (ctxt->myDoc == (xmlDocPtr)0x0) {
      pxVar5 = xmlNewDoc("1.0");
      ctxt->myDoc = pxVar5;
      if (ctxt->myDoc == (xmlDocPtr)0x0) {
        xmlErrMemory(ctxt,"New Doc failed");
        return;
      }
      ctxt->myDoc->properties = 0x40;
    }
    if ((ctxt->myDoc != (xmlDocPtr)0x0) && (ctxt->myDoc->intSubset == (_xmlDtd *)0x0)) {
      xmlCreateIntSubset(ctxt->myDoc,(xmlChar *)0x0,ExternalID,_enc);
    }
    ctxt->instate = XML_PARSER_DTD;
    ctxt->external = 1;
    xmlSkipBlankChars(ctxt);
    do {
      if (((*ctxt->input->cur != '<') || (bVar6 = true, ctxt->input->cur[1] != '?')) &&
         ((*ctxt->input->cur != '<' || (bVar6 = true, ctxt->input->cur[1] != '!')))) {
        bVar6 = *ctxt->input->cur == '%';
      }
      if (!bVar6) goto LAB_0017bfb8;
      iVar1 = ctxt->input->id;
      uVar2 = ctxt->input->consumed;
      pxVar3 = ctxt->input->cur;
      pxVar4 = ctxt->input->base;
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
      if (((*ctxt->input->cur == '<') && (ctxt->input->cur[1] == '!')) &&
         (ctxt->input->cur[2] == '[')) {
        xmlParseConditionalSections(ctxt);
      }
      else {
        xmlParseMarkupDecl(ctxt);
      }
      xmlSkipBlankChars(ctxt);
    } while ((iVar1 != ctxt->input->id) ||
            (pxVar3 + (uVar2 - (long)pxVar4) !=
             ctxt->input->cur + (ctxt->input->consumed - (long)ctxt->input->base)));
    xmlFatalErr(ctxt,XML_ERR_EXT_SUBSET_NOT_FINISHED,(char *)0x0);
LAB_0017bfb8:
    if (*ctxt->input->cur != '\0') {
      xmlFatalErr(ctxt,XML_ERR_EXT_SUBSET_NOT_FINISHED,(char *)0x0);
    }
  }
  return;
}

Assistant:

void
xmlParseExternalSubset(xmlParserCtxtPtr ctxt, const xmlChar *ExternalID,
                       const xmlChar *SystemID) {
    xmlDetectSAX2(ctxt);
    GROW;

    if ((ctxt->encoding == NULL) &&
        (ctxt->input->end - ctxt->input->cur >= 4)) {
        xmlChar start[4];
	xmlCharEncoding enc;

	start[0] = RAW;
	start[1] = NXT(1);
	start[2] = NXT(2);
	start[3] = NXT(3);
	enc = xmlDetectCharEncoding(start, 4);
	if (enc != XML_CHAR_ENCODING_NONE)
	    xmlSwitchEncoding(ctxt, enc);
    }

    if (CMP5(CUR_PTR, '<', '?', 'x', 'm', 'l')) {
	xmlParseTextDecl(ctxt);
	if (ctxt->errNo == XML_ERR_UNSUPPORTED_ENCODING) {
	    /*
	     * The XML REC instructs us to stop parsing right here
	     */
	    xmlHaltParser(ctxt);
	    return;
	}
    }
    if (ctxt->myDoc == NULL) {
        ctxt->myDoc = xmlNewDoc(BAD_CAST "1.0");
	if (ctxt->myDoc == NULL) {
	    xmlErrMemory(ctxt, "New Doc failed");
	    return;
	}
	ctxt->myDoc->properties = XML_DOC_INTERNAL;
    }
    if ((ctxt->myDoc != NULL) && (ctxt->myDoc->intSubset == NULL))
        xmlCreateIntSubset(ctxt->myDoc, NULL, ExternalID, SystemID);

    ctxt->instate = XML_PARSER_DTD;
    ctxt->external = 1;
    SKIP_BLANKS;
    while (((RAW == '<') && (NXT(1) == '?')) ||
           ((RAW == '<') && (NXT(1) == '!')) ||
	   (RAW == '%')) {
	int id = ctxt->input->id;
	unsigned long cons = CUR_CONSUMED;

	GROW;
        if ((RAW == '<') && (NXT(1) == '!') && (NXT(2) == '[')) {
	    xmlParseConditionalSections(ctxt);
	} else
	    xmlParseMarkupDecl(ctxt);
        SKIP_BLANKS;

	if ((id == ctxt->input->id) && (cons == CUR_CONSUMED)) {
	    xmlFatalErr(ctxt, XML_ERR_EXT_SUBSET_NOT_FINISHED, NULL);
	    break;
	}
    }

    if (RAW != 0) {
	xmlFatalErr(ctxt, XML_ERR_EXT_SUBSET_NOT_FINISHED, NULL);
    }

}